

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReorganizeDataLayerParams::SerializeWithCachedSizes
          (ReorganizeDataLayerParams *this,CodedOutputStream *output)

{
  ReorganizeDataLayerParams_ReorganizationType RVar1;
  uint64 uVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ReorganizeDataLayerParams *this_local;
  
  RVar1 = mode(this);
  if (RVar1 != ReorganizeDataLayerParams_ReorganizationType_SPACE_TO_DEPTH) {
    RVar1 = mode(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(1,RVar1,output);
  }
  uVar2 = blocksize(this);
  if (uVar2 != 0) {
    uVar2 = blocksize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,uVar2,output);
  }
  return;
}

Assistant:

void ReorganizeDataLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ReorganizeDataLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.ReorganizeDataLayerParams.ReorganizationType mode = 1;
  if (this->mode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->mode(), output);
  }

  // uint64 blockSize = 2;
  if (this->blocksize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->blocksize(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ReorganizeDataLayerParams)
}